

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  int iVar1;
  CURLsslset CVar2;
  Curl_ssl *pCVar3;
  Curl_ssl **ppCVar4;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    if (available_backends[0] == (Curl_ssl *)0x0) {
LAB_0014bfc0:
      CVar2 = CURLSSLSET_UNKNOWN_BACKEND;
      if (avail != (curl_ssl_backend ***)0x0) {
        *avail = (curl_ssl_backend **)available_backends;
      }
    }
    else {
      if ((available_backends[0]->info).id == id) {
        ppCVar4 = available_backends;
      }
      else {
        ppCVar4 = available_backends;
        pCVar3 = available_backends[0];
        do {
          if (name != (char *)0x0) {
            iVar1 = Curl_strcasecompare((pCVar3->info).name,name);
            if (iVar1 != 0) break;
          }
          pCVar3 = ppCVar4[1];
          if (pCVar3 == (Curl_ssl *)0x0) goto LAB_0014bfc0;
          ppCVar4 = ppCVar4 + 1;
        } while ((pCVar3->info).id != id);
      }
      multissl_init(*ppCVar4);
      CVar2 = CURLSSLSET_OK;
    }
  }
  else {
    CVar2 = (uint)((Curl_ssl->info).id != id) * 2;
  }
  return CVar2;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  int i;

  if(Curl_ssl != &Curl_ssl_multi)
    return id == Curl_ssl->info.id ? CURLSSLSET_OK : CURLSSLSET_TOO_LATE;

  for(i = 0; available_backends[i]; i++) {
    if(available_backends[i]->info.id == id ||
       (name && strcasecompare(available_backends[i]->info.name, name))) {
      multissl_init(available_backends[i]);
      return CURLSSLSET_OK;
    }
  }

  if(avail)
    *avail = (const curl_ssl_backend **)&available_backends;
  return CURLSSLSET_UNKNOWN_BACKEND;
}